

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O0

bool __thiscall sf::priv::GlxContext::makeCurrent(GlxContext *this,bool current)

{
  int iVar1;
  byte in_SIL;
  long in_RDI;
  bool result;
  undefined1 local_12;
  undefined1 local_1;
  
  if (*(long *)(in_RDI + 0x40) == 0) {
    local_1 = false;
  }
  else {
    local_12 = false;
    if ((in_SIL & 1) == 0) {
      iVar1 = (*sf_glad_glXMakeCurrent)(*(Display **)(in_RDI + 0x30),0,(GLXContext)0x0);
      local_12 = iVar1 != 0;
    }
    else if (*(long *)(in_RDI + 0x48) == 0) {
      if (*(long *)(in_RDI + 0x38) != 0) {
        iVar1 = (*sf_glad_glXMakeCurrent)
                          (*(Display **)(in_RDI + 0x30),*(GLXDrawable *)(in_RDI + 0x38),
                           *(GLXContext *)(in_RDI + 0x40));
        local_12 = iVar1 != 0;
      }
    }
    else {
      iVar1 = (*sf_glad_glXMakeContextCurrent)
                        (*(Display **)(in_RDI + 0x30),*(GLXDrawable *)(in_RDI + 0x48),
                         *(GLXDrawable *)(in_RDI + 0x48),*(GLXContext *)(in_RDI + 0x40));
      local_12 = iVar1 != 0;
    }
    local_1 = local_12;
  }
  return local_1;
}

Assistant:

bool GlxContext::makeCurrent(bool current)
{
    if (!m_context)
        return false;

#if defined(GLX_DEBUGGING)
    GlxErrorHandler handler(m_display);
#endif

    bool result = false;

    if (current)
    {
        if (m_pbuffer)
        {
            result = glXMakeContextCurrent(m_display, m_pbuffer, m_pbuffer, m_context);
        }
        else if (m_window)
        {
            result = glXMakeCurrent(m_display, m_window, m_context);
        }
    }
    else
    {
        result = glXMakeCurrent(m_display, None, NULL);
    }

#if defined(GLX_DEBUGGING)
    if (glxErrorOccurred)
        err() << "GLX error in GlxContext::makeCurrent()" << std::endl;
#endif

    return result;
}